

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_compare.cpp
# Opt level: O0

void Omega_h::parse_exodiff_cmd_file
               (Mesh *mesh,string *path,MeshCompareOpts *p_opts,VarCompareOpts all_defaults)

{
  VarCompareOpts default_opts;
  VarCompareOpts default_opts_00;
  Real RVar1;
  Real RVar2;
  byte bVar3;
  bool bVar4;
  Int IVar5;
  _Ios_Openmode _Var6;
  Int IVar7;
  char *pcVar8;
  undefined8 uVar9;
  istream *piVar10;
  ulong uVar11;
  reference pvVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  size_type sVar15;
  TagBase *pTVar16;
  string *psVar17;
  mapped_type *pmVar18;
  TagBase *tagbase_2;
  Int i_2;
  TagBase *tagbase_1;
  Int i_1;
  VarCompareOpts local_5a0;
  byte local_581;
  size_t sStack_580;
  bool do_all;
  size_t start;
  Real RStack_570;
  Real local_568;
  undefined1 local_558 [8];
  VarCompareOpts opts_1;
  string local_538 [32];
  VarCompareOpts local_518;
  undefined1 local_500 [8];
  VarCompareOpts opts;
  TagBase *tagbase;
  Int i;
  undefined1 local_4b8 [8];
  VarCompareOpts variable_opts;
  _Self local_490;
  _Self local_488;
  iterator it;
  string local_460 [8];
  value_type name;
  string local_440 [8];
  string token;
  undefined1 local_420 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  stringstream line_stream;
  string local_278 [8];
  string line;
  undefined1 auStack_258 [8];
  VarCompareOpts variables_opts;
  Int variables_dim;
  Int linenum;
  Int mesh_dim;
  istream local_228 [8];
  ifstream file;
  MeshCompareOpts *p_opts_local;
  string *path_local;
  Mesh *mesh_local;
  
  default_opts_00 = all_defaults;
  pcVar8 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_228,pcVar8,_S_in);
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    uVar9 = std::__cxx11::string::c_str();
    fail("Could not open exodiff file \"%s\"\n",uVar9);
  }
  IVar5 = Mesh::dim(mesh);
  variables_opts.floor._4_4_ = 1;
  variables_opts.floor._0_4_ = -1;
  std::__cxx11::string::string(local_278);
  do {
    piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,local_278);
    bVar4 = std::ios::operator_cast_to_bool(piVar10 + *(long *)(*(long *)piVar10 + -0x18));
    if (!bVar4) {
      std::__cxx11::string::~string(local_278);
      if ((variables_opts.floor._0_4_ != -1) &&
         (bVar4 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
                  ::empty(p_opts->tags2opts + variables_opts.floor._0_4_), bVar4)) {
        for (tagbase_2._4_4_ = 0; IVar5 = Mesh::ntags(mesh,variables_opts.floor._0_4_),
            tagbase_2._4_4_ < IVar5; tagbase_2._4_4_ = tagbase_2._4_4_ + 1) {
          pTVar16 = Mesh::get_tag(mesh,variables_opts.floor._0_4_,tagbase_2._4_4_);
          psVar17 = TagBase::name_abi_cxx11_(pTVar16);
          pmVar18 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
                    ::operator[](p_opts->tags2opts + variables_opts.floor._0_4_,psVar17);
          *(undefined1 (*) [8])pmVar18 = auStack_258;
          pmVar18->tolerance = (Real)variables_opts._0_8_;
          pmVar18->floor = variables_opts.tolerance;
        }
      }
      std::ifstream::~ifstream(local_228);
      return;
    }
    _Var6 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)
               &tokens.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,local_278,_Var6);
    uVar11 = std::__cxx11::string::empty();
    if ((uVar11 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_420);
      std::__cxx11::string::string(local_440);
      while( true ) {
        piVar10 = std::operator>>((istream *)
                                  &tokens.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,local_440);
        bVar4 = std::ios::operator_cast_to_bool(piVar10 + *(long *)(*(long *)piVar10 + -0x18));
        if (!bVar4) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_420,(value_type *)local_440);
      }
      std::__cxx11::string::~string(local_440);
      bVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_420);
      if (!bVar4) {
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_420,0);
        pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)pvVar12);
        if (*pcVar8 != '#') {
          if ((variables_opts.floor._0_4_ == -1) ||
             (pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_278), *pcVar8 != '\t'))
          {
            if ((variables_opts.floor._0_4_ == -1) ||
               ((pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_278),
                *pcVar8 == '\t' ||
                (bVar4 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
                         ::empty(p_opts->tags2opts + variables_opts.floor._0_4_), !bVar4)))) {
              pvVar12 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_420,0);
              bVar4 = std::operator==(pvVar12,"COORDINATES");
              if (bVar4) {
                all_defaults.floor = default_opts_00.floor;
                local_518.floor = all_defaults.floor;
                all_defaults._0_8_ = default_opts_00._0_8_;
                local_518.type = all_defaults.type;
                local_518._4_4_ = all_defaults._4_4_;
                all_defaults.tolerance = default_opts_00.tolerance;
                local_518.tolerance = all_defaults.tolerance;
                parse_compare_opts((VarCompareOpts *)local_500,
                                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_420,1,default_opts_00,path,variables_opts.floor._4_4_);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_538,"coordinates",(allocator *)((long)&opts_1.floor + 7));
                pmVar18 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
                          ::operator[](p_opts->tags2opts,(key_type *)local_538);
                *(undefined1 (*) [8])pmVar18 = local_500;
                pmVar18->tolerance = (Real)opts._0_8_;
                pmVar18->floor = opts.tolerance;
                std::__cxx11::string::~string(local_538);
                std::allocator<char>::~allocator((allocator<char> *)((long)&opts_1.floor + 7));
              }
              else {
                pvVar12 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_420,0);
                bVar4 = std::operator==(pvVar12,"TIME");
                if ((bVar4) &&
                   (sVar15 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_420), 1 < sVar15)) {
                  pvVar12 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_420,1);
                  bVar4 = std::operator==(pvVar12,"STEPS");
                  if (bVar4) {
                    local_568 = (p_opts->time_step_opts).floor;
                    start = *(size_t *)&p_opts->time_step_opts;
                    RStack_570 = (p_opts->time_step_opts).tolerance;
                    parse_compare_opts((VarCompareOpts *)local_558,
                                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_420,2,p_opts->time_step_opts,path,
                                       variables_opts.floor._4_4_);
                    *(undefined1 (*) [8])&p_opts->time_step_opts = local_558;
                    (p_opts->time_step_opts).tolerance = (Real)opts_1._0_8_;
                    (p_opts->time_step_opts).floor = opts_1.tolerance;
                    goto LAB_003d7dff;
                  }
                }
                if (variables_opts.floor._0_4_ == -1) {
                  pvVar12 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_420,0);
                  IVar7 = parse_dim_token(pvVar12,IVar5);
                  if (IVar7 != -1) {
                    pvVar12 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)local_420,0);
                    variables_opts.floor._0_4_ = parse_dim_token(pvVar12,IVar5);
                    sVar15 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_420);
                    if (sVar15 < 2) {
LAB_003d7bd8:
                      uVar9 = std::__cxx11::string::c_str();
                      fail("bad variables header at %s +%d\n",uVar9,
                           (ulong)variables_opts.floor._4_4_);
                    }
                    pvVar12 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)local_420,1);
                    bVar4 = std::operator==(pvVar12,"VARIABLES");
                    if (!bVar4) goto LAB_003d7bd8;
                    sStack_580 = 2;
                    local_581 = 0;
                    sVar15 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_420);
                    if (2 < sVar15) {
                      pvVar12 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)local_420,2);
                      bVar4 = std::operator==(pvVar12,"(all)");
                      if (bVar4) {
                        local_581 = 1;
                        sStack_580 = sStack_580 + 1;
                      }
                    }
                    parse_compare_opts(&local_5a0,
                                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_420,sStack_580,default_opts_00,path,
                                       variables_opts.floor._4_4_);
                    RVar2 = local_5a0.floor;
                    RVar1 = local_5a0.tolerance;
                    uVar9 = local_5a0._0_8_;
                    auStack_258 = (undefined1  [8])local_5a0._0_8_;
                    variables_opts._0_8_ = local_5a0.tolerance;
                    variables_opts.tolerance = local_5a0.floor;
                    if ((local_581 & 1) != 0) {
                      for (tagbase_1._4_4_ = 0; IVar7 = Mesh::ntags(mesh,variables_opts.floor._0_4_)
                          , tagbase_1._4_4_ < IVar7; tagbase_1._4_4_ = tagbase_1._4_4_ + 1) {
                        pTVar16 = Mesh::get_tag(mesh,variables_opts.floor._0_4_,tagbase_1._4_4_);
                        psVar17 = TagBase::name_abi_cxx11_(pTVar16);
                        pmVar18 = std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
                                  ::operator[](p_opts->tags2opts + variables_opts.floor._0_4_,
                                               psVar17);
                        uVar13 = local_5a0._0_8_;
                        local_5a0.type = (anon_enum_32)uVar9;
                        local_5a0._4_4_ = SUB84(uVar9,4);
                        pmVar18->type = local_5a0.type;
                        *(undefined4 *)&pmVar18->field_0x4 = local_5a0._4_4_;
                        pmVar18->tolerance = RVar1;
                        pmVar18->floor = RVar2;
                        local_5a0._0_8_ = uVar13;
                      }
                    }
                  }
                }
              }
            }
            else {
              for (tagbase._4_4_ = 0; IVar7 = Mesh::ntags(mesh,variables_opts.floor._0_4_),
                  tagbase._4_4_ < IVar7; tagbase._4_4_ = tagbase._4_4_ + 1) {
                opts.floor = (Real)Mesh::get_tag(mesh,variables_opts.floor._0_4_,tagbase._4_4_);
                psVar17 = TagBase::name_abi_cxx11_((TagBase *)opts.floor);
                pmVar18 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
                          ::operator[](p_opts->tags2opts + variables_opts.floor._0_4_,psVar17);
                *(undefined1 (*) [8])pmVar18 = auStack_258;
                pmVar18->tolerance = (Real)variables_opts._0_8_;
                pmVar18->floor = variables_opts.tolerance;
              }
              variables_opts.floor._0_4_ = -1;
            }
          }
          else {
            pvVar12 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_420,0);
            std::__cxx11::string::string(local_460,(string *)pvVar12);
            pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_460);
            if (*pcVar8 == '!') {
              std::__cxx11::string::substr((ulong)&it,(ulong)local_460);
              std::__cxx11::string::operator=(local_460,(string *)&it);
              std::__cxx11::string::~string((string *)&it);
              bVar4 = Mesh::has_tag(mesh,variables_opts.floor._0_4_,(string *)local_460);
              if (!bVar4) {
                uVar9 = std::__cxx11::string::c_str();
                uVar13 = std::__cxx11::string::c_str();
                fail("variable \"%s\" not in mesh (%s +%d)\n",uVar9,uVar13,
                     (ulong)variables_opts.floor._4_4_);
              }
              local_488._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
                   ::find(p_opts->tags2opts + variables_opts.floor._0_4_,(key_type *)local_460);
              local_490._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
                   ::end(p_opts->tags2opts + variables_opts.floor._0_4_);
              bVar4 = std::operator==(&local_488,&local_490);
              if (bVar4) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_420,0);
                uVar9 = std::__cxx11::string::c_str();
                uVar13 = std::__cxx11::string::c_str();
                uVar14 = std::__cxx11::string::c_str();
                fail("directive \"%s\" but %s not included (%s +%d)\nmake sure \"(all)\" is added to the variables line\n"
                     ,uVar9,uVar13,uVar14,(ulong)variables_opts.floor._4_4_);
              }
              variable_opts.floor =
                   (Real)std::
                         map<std::__cxx11::string,Omega_h::VarCompareOpts,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Omega_h::VarCompareOpts>>>
                         ::erase_abi_cxx11_((map<std::__cxx11::string,Omega_h::VarCompareOpts,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Omega_h::VarCompareOpts>>>
                                             *)(p_opts->tags2opts + variables_opts.floor._0_4_),
                                            (iterator)local_488._M_node);
            }
            else {
              bVar4 = Mesh::has_tag(mesh,variables_opts.floor._0_4_,(string *)local_460);
              if (!bVar4) {
                uVar9 = std::__cxx11::string::c_str();
                uVar13 = std::__cxx11::string::c_str();
                fail("variable \"%s\" not in mesh (%s +%d)\n",uVar9,uVar13,
                     (ulong)variables_opts.floor._4_4_);
              }
              default_opts.tolerance = (Real)variables_opts._0_8_;
              default_opts._0_8_ = auStack_258;
              default_opts.floor = variables_opts.tolerance;
              parse_compare_opts((VarCompareOpts *)local_4b8,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_420,1,default_opts,path,variables_opts.floor._4_4_);
              pmVar18 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
                        ::operator[](p_opts->tags2opts + variables_opts.floor._0_4_,
                                     (key_type *)local_460);
              *(undefined1 (*) [8])pmVar18 = local_4b8;
              pmVar18->tolerance = (Real)variable_opts._0_8_;
              pmVar18->floor = variable_opts.tolerance;
            }
            std::__cxx11::string::~string(local_460);
          }
LAB_003d7dff:
          variables_opts.floor._4_4_ = variables_opts.floor._4_4_ + 1;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_420);
    }
    std::__cxx11::stringstream::~stringstream
              ((stringstream *)
               &tokens.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  } while( true );
}

Assistant:

static void parse_exodiff_cmd_file(Mesh const* mesh, std::string const& path,
    MeshCompareOpts* p_opts, VarCompareOpts all_defaults) {
  std::ifstream file(path.c_str());
  if (!file.is_open()) {
    Omega_h_fail("Could not open exodiff file \"%s\"\n", path.c_str());
  }
  auto mesh_dim = mesh->dim();
  Int linenum = 1;
  Int variables_dim = -1;
  VarCompareOpts variables_opts;
  for (std::string line; std::getline(file, line);) {
    std::stringstream line_stream(line);
    if (line.empty()) continue;
    std::vector<std::string> tokens;
    for (std::string token; line_stream >> token;) tokens.push_back(token);
    if (tokens.empty()) continue;
    if (tokens[0][0] == '#') continue;
    if (variables_dim != -1 && line[0] == '\t') {
      auto name = tokens[0];
      if (name[0] == '!') {
        name = name.substr(1, std::string::npos);
        if (!mesh->has_tag(variables_dim, name)) {
          Omega_h_fail("variable \"%s\" not in mesh (%s +%d)\n", name.c_str(),
              path.c_str(), linenum);
        }
        auto it = p_opts->tags2opts[variables_dim].find(name);
        if (it == p_opts->tags2opts[variables_dim].end()) {
          Omega_h_fail(
              "directive \"%s\" but %s not included (%s +%d)\n"
              "make sure \"(all)\" is added to the variables line\n",
              tokens[0].c_str(), name.c_str(), path.c_str(), linenum);
        }
        p_opts->tags2opts[variables_dim].erase(it);
      } else {
        if (!mesh->has_tag(variables_dim, name)) {
          Omega_h_fail("variable \"%s\" not in mesh (%s +%d)\n", name.c_str(),
              path.c_str(), linenum);
        }
        auto variable_opts =
            parse_compare_opts(tokens, 1, variables_opts, path, linenum);
        p_opts->tags2opts[variables_dim][name] = variable_opts;
      }
    } else if (variables_dim != -1 && line[0] != '\t' &&
               p_opts->tags2opts[variables_dim].empty()) {
      for (Int i = 0; i < mesh->ntags(variables_dim); ++i) {
        auto tagbase = mesh->get_tag(variables_dim, i);
        p_opts->tags2opts[variables_dim][tagbase->name()] = variables_opts;
      }
      variables_dim = -1;
    } else if (tokens[0] == "COORDINATES") {
      auto opts = parse_compare_opts(tokens, 1, all_defaults, path, linenum);
      p_opts->tags2opts[VERT]["coordinates"] = opts;
    } else if (tokens[0] == "TIME" && tokens.size() > 1 &&
               tokens[1] == "STEPS") {
      auto opts =
          parse_compare_opts(tokens, 2, p_opts->time_step_opts, path, linenum);
      p_opts->time_step_opts = opts;
    } else if (variables_dim == -1 &&
               parse_dim_token(tokens[0], mesh_dim) != -1) {
      variables_dim = parse_dim_token(tokens[0], mesh_dim);
      if (!(tokens.size() > 1 && tokens[1] == "VARIABLES")) {
        Omega_h_fail("bad variables header at %s +%d\n", path.c_str(), linenum);
      }
      std::size_t start = 2;
      bool do_all = false;
      if (tokens.size() > 2 && tokens[2] == "(all)") {
        do_all = true;
        ++start;
      }
      variables_opts =
          parse_compare_opts(tokens, start, all_defaults, path, linenum);
      if (do_all) {
        for (Int i = 0; i < mesh->ntags(variables_dim); ++i) {
          auto tagbase = mesh->get_tag(variables_dim, i);
          p_opts->tags2opts[variables_dim][tagbase->name()] = variables_opts;
        }
      }
    }
    ++linenum;
  }
  if (variables_dim != -1 && p_opts->tags2opts[variables_dim].empty()) {
    for (Int i = 0; i < mesh->ntags(variables_dim); ++i) {
      auto tagbase = mesh->get_tag(variables_dim, i);
      p_opts->tags2opts[variables_dim][tagbase->name()] = variables_opts;
    }
  }
}